

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error __thiscall video::src_format<37,48>(video *this,context *ctx,token *token,opcode *op)

{
  _Storage<unsigned_long,_true> _Var1;
  uint64_t bits;
  uint64_t bits_00;
  string_view prefix;
  string_view prefix_00;
  optional<unsigned_long> oVar2;
  token local_58;
  
  bits_00 = 0x1000000000000;
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar2 = find_in_table(token,src_format<37,_48>::signed_table,prefix);
  _Var1._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    prefix_00._M_str = ".";
    prefix_00._M_len = 1;
    oVar2 = find_in_table(token,src_format<37,_48>::unsigned_table,prefix_00);
    _Var1._M_value =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      bits = 0x6000000000;
      goto LAB_00124bb7;
    }
    bits_00 = 0;
  }
  else {
    bits_00 = 0x1000000000000;
  }
  context::tokenize(&local_58,ctx);
  token->column = local_58.column;
  (token->data).string._M_str = local_58.data.string._M_str;
  token->type = local_58.type;
  token->line = local_58.line;
  token->filename = local_58.filename;
  (token->data).predicate = local_58.data.predicate;
  bits = _Var1._M_value << 0x25;
LAB_00124bb7:
  opcode::add_bits(op,bits);
  opcode::add_bits(op,bits_00);
  *(undefined8 *)this = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(src_format)
    {
        static const char* signed_table[] = {"S8", "", "S16", "S32", nullptr};
        static const char* unsigned_table[] = {"U8", "", "U16", "U32", nullptr};
        bool is_signed = true;
        std::optional<int64_t> result = find_in_table(token, signed_table, ".");
        if (!result) {
            is_signed = false;
            result = find_in_table(token, unsigned_table, ".");
            if (!result) {
                is_signed = true;
            }
        }
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(3) << address); // .U32
        op.add_bits((is_signed ? 1ULL : 0ULL) << sign_address);
        return {};
    }